

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
InitializeSlots<std::allocator<char>,112ul,false,false,8ul>
          (HashSetResizeHelper *this,CommonFields *c,allocator<char> *param_3)

{
  ulong uVar1;
  ulong uVar2;
  ctrl_t *new_ctrl;
  void *pvVar3;
  long *plVar4;
  size_t capacity_00;
  size_t capacity;
  ctrl_t *ctrl;
  RawHashSetLayout layout;
  RawHashSetLayout local_48;
  
  capacity_00 = c->capacity_;
  if (capacity_00 == 0) {
    __assert_fail("(c.capacity()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x81d,
                  "bool absl::container_internal::HashSetResizeHelper::InitializeSlots(CommonFields &, Alloc, ctrl_t, size_t, size_t) [Alloc = std::allocator<char>, SizeOfSlot = 112UL, TransferUsesMemcpy = false, SooEnabled = false, AlignOfSlot = 8UL]"
                 );
  }
  if ((this->old_capacity_ != 0) && ((c->size_ & 1) != 0)) {
    CommonFields::backing_array_start(c);
    capacity_00 = c->capacity_;
  }
  RawHashSetLayout::RawHashSetLayout(&local_48,capacity_00,8,false);
  if (~local_48.slot_offset_ / local_48.capacity_ < 0x70) {
    __assert_fail("(slot_size <= ((std::numeric_limits<size_t>::max)() - slot_offset_) / capacity_) && \"Try enabling sanitizers.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x4cf,
                  "size_t absl::container_internal::RawHashSetLayout::alloc_size(size_t) const");
  }
  pvVar3 = Allocate<8ul,std::allocator<char>>
                     (param_3,local_48.capacity_ * 0x70 + local_48.slot_offset_);
  (c->heap_or_soo_).heap.control = (ctrl_t *)((long)pvVar3 + local_48.control_offset_);
  plVar4 = (long *)((long)pvVar3 + (local_48.control_offset_ - 8));
  (c->heap_or_soo_).heap.slot_array.p = (void *)((long)pvVar3 + local_48.slot_offset_);
  if (((ulong)plVar4 & 7) != 0) {
    __assert_fail("(reinterpret_cast<uintptr_t>(gl_ptr) % alignof(GrowthInfo) == 0) && \"Try enabling sanitizers.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x590,"GrowthInfo &absl::container_internal::CommonFields::growth_info()");
  }
  uVar1 = c->capacity_;
  if ((uVar1 != 0) && ((uVar1 + 1 & uVar1) == 0)) {
    *plVar4 = uVar1 - ((c->size_ >> 1) + (uVar1 >> 3));
    uVar2 = this->old_capacity_;
    new_ctrl = (c->heap_or_soo_).heap.control;
    if (uVar2 == 0 || (uVar2 >= local_48.capacity_ || local_48.capacity_ >= 0x11)) {
      memset(new_ctrl,0x80,uVar1 + 0x10);
      new_ctrl[uVar1] = kSentinel;
    }
    else {
      GrowIntoSingleGroupShuffleControlBytes(this,new_ctrl,local_48.capacity_);
    }
    *(byte *)&c->size_ = (byte)c->size_ & 0xfe;
    return uVar2 < local_48.capacity_ && local_48.capacity_ < 0x11;
  }
  __assert_fail("(IsValidCapacity(capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x622,"size_t absl::container_internal::CapacityToGrowth(size_t)");
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE bool InitializeSlots(CommonFields& c, Alloc alloc,
                                               ctrl_t soo_slot_h2,
                                               size_t key_size,
                                               size_t value_size) {
    ABSL_SWISSTABLE_ASSERT(c.capacity());
    HashtablezInfoHandle infoz =
        ShouldSampleHashtablezInfo<Alloc>()
            ? SampleHashtablezInfo<SooEnabled>(SizeOfSlot, key_size, value_size,
                                               old_capacity_, was_soo_,
                                               forced_infoz_, c)
            : HashtablezInfoHandle{};

    const bool has_infoz = infoz.IsSampled();
    RawHashSetLayout layout(c.capacity(), AlignOfSlot, has_infoz);
    char* mem = static_cast<char*>(Allocate<BackingArrayAlignment(AlignOfSlot)>(
        &alloc, layout.alloc_size(SizeOfSlot)));
    const GenerationType old_generation = c.generation();
    c.set_generation_ptr(
        reinterpret_cast<GenerationType*>(mem + layout.generation_offset()));
    c.set_generation(NextGeneration(old_generation));
    c.set_control(reinterpret_cast<ctrl_t*>(mem + layout.control_offset()));
    c.set_slots(mem + layout.slot_offset());
    ResetGrowthLeft(c);

    const bool grow_single_group =
        IsGrowingIntoSingleGroupApplicable(old_capacity_, layout.capacity());
    if (SooEnabled && was_soo_ && grow_single_group) {
      InitControlBytesAfterSoo(c.control(), soo_slot_h2, layout.capacity());
      if (TransferUsesMemcpy && had_soo_slot_) {
        TransferSlotAfterSoo(c, SizeOfSlot);
      }
      // SooEnabled implies that old_capacity_ != 0.
    } else if ((SooEnabled || old_capacity_ != 0) && grow_single_group) {
      if (TransferUsesMemcpy) {
        GrowSizeIntoSingleGroupTransferable(c, SizeOfSlot);
        DeallocateOld<AlignOfSlot>(alloc, SizeOfSlot);
      } else {
        GrowIntoSingleGroupShuffleControlBytes(c.control(), layout.capacity());
      }
    } else {
      ResetCtrl(c, SizeOfSlot);
    }

    c.set_has_infoz(has_infoz);
    if (has_infoz) {
      infoz.RecordStorageChanged(c.size(), layout.capacity());
      if ((SooEnabled && was_soo_) || grow_single_group || old_capacity_ == 0) {
        infoz.RecordRehash(0);
      }
      c.set_infoz(infoz);
    }
    return grow_single_group;
  }